

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall
kj::anon_unknown_59::InMemoryDirectory::SymlinkNode::parse
          (Path *__return_storage_ptr__,SymlinkNode *this)

{
  ArrayPtr<const_char> local_80;
  undefined1 local_70 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1447:7)>
  _kjContext1447;
  anon_class_8_1_8991fb9c _kjContextFunc1447;
  SymlinkNode *this_local;
  
  _kjContext1447.func = (anon_class_8_1_8991fb9c *)this;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++:1447:7)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1447:7)>
                 *)local_70,(anon_class_8_1_8991fb9c *)&_kjContext1447.func);
  StringPtr::StringPtr((StringPtr *)&local_80,&this->content);
  Path::parse(__return_storage_ptr__,(StringPtr)local_80);
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++:1447:7)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_filesystem_c__:1447:7)>
                  *)local_70);
  return __return_storage_ptr__;
}

Assistant:

Path parse() const {
      KJ_CONTEXT("parsing symlink", content);
      return Path::parse(content);
    }